

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void glist_noselect(_glist *x)

{
  t_editor *ptVar1;
  
  ptVar1 = x->gl_editor;
  if (ptVar1 != (t_editor *)0x0) {
    while (ptVar1->e_selection != (t_selection *)0x0) {
      glist_deselect(x,ptVar1->e_selection->sel_what);
      ptVar1 = x->gl_editor;
    }
    if ((ptVar1->field_0x88 & 0x20) != 0) {
      ptVar1->field_0x88 = ptVar1->field_0x88 & 0xdf;
      _editor_selectlinecolor(x,"black");
      return;
    }
  }
  return;
}

Assistant:

void glist_noselect(t_glist *x)
{
    if (x->gl_editor)
    {
        while (x->gl_editor->e_selection)
            glist_deselect(x, x->gl_editor->e_selection->sel_what);
        if (x->gl_editor->e_selectedline)
            glist_deselectline(x);
    }
}